

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

ArrayNew * __thiscall
wasm::Builder::makeArrayNew(Builder *this,HeapType type,Expression *size,Expression *init)

{
  ArrayNew *this_00;
  
  this_00 = (ArrayNew *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression._id = ArrayNewId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type.id = 0;
  this_00->size = size;
  this_00->init = init;
  if (((uint)(0x7c < type.id) * 4 + 3 & (uint)type.id) == 0) {
    (this_00->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type.id = type.id
    ;
    ArrayNew::finalize(this_00);
    return this_00;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

ArrayNew*
  makeArrayNew(HeapType type, Expression* size, Expression* init = nullptr) {
    auto* ret = wasm.allocator.alloc<ArrayNew>();
    ret->size = size;
    ret->init = init;
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }